

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deorbitalized.hpp
# Opt level: O1

void ExchCXX::
     kernel_traits<ExchCXX::Deorbitalized<ExchCXX::BuiltinR2SCAN_X,_ExchCXX::BuiltinPC07OPT_K>_>::
     eval_exc_polar(double rho_a,double rho_b,double sigma_aa,double sigma_ab,double sigma_bb,
                   double lapl_a,double lapl_b,double tau_a,double tau_b,double *eps)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double TAU_B;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_48;
  double local_38;
  double local_28;
  double local_18;
  
  local_68 = lapl_a;
  local_60 = lapl_b;
  local_58 = rho_b;
  local_48 = rho_a;
  local_38 = sigma_bb;
  local_28 = sigma_aa;
  local_18 = sigma_ab;
  if (rho_a <= 1e-15) {
    local_70 = 0.0;
  }
  else {
    dVar3 = 1.0000000000000052e-40;
    if (1.0000000000000052e-40 <= sigma_aa) {
      dVar3 = sigma_aa;
    }
    dVar8 = (dVar3 + 1.0000000000000052e-40) * 0.5;
    dVar9 = 1e-15;
    if (1e-15 <= rho_a) {
      dVar9 = rho_a;
    }
    dVar6 = (double)(~-(ulong)(-dVar8 <= dVar8) & (ulong)-dVar8);
    uVar1 = -(ulong)(dVar6 <= dVar8);
    kernel_traits<ExchCXX::BuiltinPC07OPT_K>::eval_exc_polar_impl
              (dVar9,1e-15,dVar3,(double)(~uVar1 & (ulong)dVar8 | uVar1 & (ulong)dVar6),
               1.0000000000000052e-40,lapl_a,0.0,0.0,0.0,&local_70);
  }
  if (local_58 <= 1e-15) {
    local_78 = 0.0;
  }
  else {
    dVar3 = 1.0000000000000052e-40;
    if (1.0000000000000052e-40 <= local_38) {
      dVar3 = local_38;
    }
    dVar8 = (dVar3 + 1.0000000000000052e-40) * 0.5;
    dVar9 = 1e-15;
    if (1e-15 <= local_58) {
      dVar9 = local_58;
    }
    dVar6 = (double)(~-(ulong)(-dVar8 <= dVar8) & (ulong)-dVar8);
    uVar1 = -(ulong)(dVar6 <= dVar8);
    kernel_traits<ExchCXX::BuiltinPC07OPT_K>::eval_exc_polar_impl
              (dVar9,1e-15,dVar3,(double)(~uVar1 & (ulong)dVar8 | uVar1 & (ulong)dVar6),
               1.0000000000000052e-40,local_60,0.0,0.0,0.0,&local_78);
  }
  auVar2._8_8_ = local_58;
  auVar2._0_8_ = local_48;
  local_70 = local_70 * local_48;
  local_78 = local_78 * local_58;
  if (local_48 + local_58 <= 1e-11) {
    *eps = 0.0;
  }
  else {
    auVar5._8_8_ = local_38;
    auVar5._0_8_ = local_28;
    auVar5 = maxpd(_DAT_01041230,auVar5);
    auVar2 = maxpd(_DAT_01041220,auVar2);
    auVar7._8_8_ = local_78;
    auVar7._0_8_ = local_70;
    auVar7 = maxpd(_DAT_01041200,auVar7);
    auVar4._0_8_ = auVar2._0_8_ * 8.0 * auVar7._0_8_;
    auVar4._8_8_ = auVar2._8_8_ * 8.0 * auVar7._8_8_;
    auVar5 = minpd(auVar4,auVar5);
    dVar3 = (auVar5._8_8_ + auVar5._0_8_) * 0.5;
    uVar1 = -(ulong)(-dVar3 <= local_18);
    dVar9 = (double)(uVar1 & (ulong)local_18 | ~uVar1 & (ulong)-dVar3);
    uVar1 = -(ulong)(dVar9 <= dVar3);
    kernel_traits<ExchCXX::BuiltinR2SCAN_X>::eval_exc_polar_impl
              (auVar2._0_8_,auVar2._8_8_,auVar5._0_8_,
               (double)(~uVar1 & (ulong)dVar3 | uVar1 & (ulong)dVar9),auVar5._8_8_,local_68,local_60
               ,auVar7._0_8_,auVar7._8_8_,eps);
  }
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar( double rho_a, double rho_b, double sigma_aa, double sigma_ab, double sigma_bb, double lapl_a, double lapl_b, double tau_a, double tau_b, double& eps ) {

    double TAU_A, TAU_B;
    ke_traits::eval_exc_polar(rho_a, 0.0, sigma_aa, 0.0, 0.0, lapl_a, 0.0, 0.0, 0.0, TAU_A);
    ke_traits::eval_exc_polar(rho_b, 0.0, sigma_bb, 0.0, 0.0, lapl_b, 0.0, 0.0, 0.0, TAU_B);

    TAU_A *= rho_a;
    TAU_B *= rho_b;
    xc_traits::eval_exc_polar(rho_a, rho_b, sigma_aa, sigma_ab, sigma_bb, lapl_a, lapl_b, TAU_A, TAU_B, eps);

  }